

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::MemoryAddr>&>
          (Section *this,shared_ptr<mocker::nasm::Addr> *args,
          shared_ptr<mocker::nasm::MemoryAddr> *args_1)

{
  allocator<char> local_41;
  string local_40;
  shared_ptr<mocker::nasm::MemoryAddr> *local_20;
  shared_ptr<mocker::nasm::MemoryAddr> *args_local_1;
  shared_ptr<mocker::nasm::Addr> *args_local;
  Section *this_local;
  
  local_20 = args_1;
  args_local_1 = (shared_ptr<mocker::nasm::MemoryAddr> *)args;
  args_local = (shared_ptr<mocker::nasm::Addr> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::MemoryAddr>&>
            (this,&local_40,(shared_ptr<mocker::nasm::Addr> *)args_local_1,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }